

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O1

string_enumeration
trial::dynamic::convert::
into<string_enumeration,trial::dynamic::basic_variable<std::allocator<char>>>
          (basic_variable<std::allocator<char>_> *u)

{
  bool bVar1;
  string_enumeration sVar2;
  error *this;
  error_code ec;
  error_code error;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = detail::
          operator_overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_char[6],_void>
          ::equal(u,"alpha");
  sVar2 = alpha;
  if (!bVar1) {
    std::error_code::operator=(&local_20,incompatible_type);
    sVar2 = 0;
  }
  if (local_20._M_value == 0) {
    return sVar2;
  }
  this = (error *)__cxa_allocate_exception(0x20);
  ec._4_4_ = 0;
  ec._M_value = local_20._M_value;
  ec._M_cat = local_20._M_cat;
  dynamic::error::error(this,ec);
  __cxa_throw(this,&dynamic::error::typeinfo,std::system_error::~system_error);
}

Assistant:

T into(const U& u)
{
    std::error_code error;
    auto result = into<T>(u, error);
    if (error)
        throw dynamic::error(error);
    return result;
}